

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O2

FT_Error af_latin_hints_apply
                   (FT_UInt glyph_index,AF_GlyphHints hints,FT_Outline *outline,
                   AF_LatinMetrics metrics)

{
  AF_AxisHintsRec *pAVar1;
  FT_Bool FVar2;
  AF_Edge pAVar3;
  AF_Segment_conflict pAVar4;
  AF_Segment pAVar5;
  AF_Edge_conflict pAVar6;
  byte bVar7;
  FT_Error FVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  AF_Width pAVar13;
  AF_Edge_conflict pAVar14;
  AF_Edge_conflict pAVar15;
  FT_Long FVar16;
  AF_Segment_conflict pAVar17;
  AF_Edge_conflict pAVar18;
  FT_Pos FVar19;
  AF_Segment_conflict pAVar20;
  ulong uVar21;
  AF_Edge_conflict pAVar22;
  AF_Edge_conflict pAVar23;
  AF_Edge_conflict pAVar24;
  AF_Edge_conflict pAVar25;
  long lVar26;
  AF_Dimension dim;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  AF_Segment_conflict pAVar34;
  long lVar35;
  ulong uVar36;
  byte bVar37;
  AF_Edge_conflict pAVar38;
  int iVar39;
  int iVar40;
  AF_Width pAVar41;
  bool bVar42;
  AF_Edge_conflict local_70;
  int local_54;
  
  FVar8 = af_glyph_hints_reload(hints,outline);
  if (FVar8 == 0) {
    uVar9 = hints->scaler_flags;
    if ((uVar9 & 1) == 0) {
      FVar8 = af_latin_hints_detect_features
                        (hints,metrics->axis[0].width_count,metrics->axis[0].widths,
                         AF_DIMENSION_HORZ);
      if (FVar8 != 0) {
        return FVar8;
      }
      uVar9 = hints->scaler_flags;
    }
    if ((uVar9 & 2) == 0) {
      FVar8 = af_latin_hints_detect_features
                        (hints,metrics->axis[1].width_count,metrics->axis[1].widths,
                         AF_DIMENSION_VERT);
      if (FVar8 != 0) {
        return FVar8;
      }
      if ((*(byte *)((long)((metrics->root).globals)->glyph_styles + (ulong)glyph_index * 2 + 1) &
          0x40) == 0) {
        pAVar18 = hints->axis[1].edges;
        if (pAVar18 == (AF_Edge_conflict)0x0) {
          local_70 = (AF_Edge_conflict)0x0;
        }
        else {
          local_70 = pAVar18 + hints->axis[1].num_edges;
        }
        lVar32 = (long)(int)metrics->axis[1].scale;
        for (; pAVar18 < local_70; pAVar18 = pAVar18 + 1) {
          bVar7 = 0;
          lVar11 = ((ulong)metrics->units_per_em / 0x28) * lVar32;
          iVar10 = (int)((ulong)(lVar11 + (lVar11 >> 0x3f) + 0x8000) >> 0x10);
          if (0x1f < iVar10) {
            iVar10 = 0x20;
          }
          uVar12 = (ulong)metrics->axis[1].blue_count;
          pAVar13 = (AF_Width)0x0;
          pAVar41 = &metrics->axis[1].blues[0].ref;
          while (bVar42 = uVar12 != 0, uVar12 = uVar12 - 1, bVar42) {
            uVar9 = *(uint *)&pAVar41[2].fit;
            iVar39 = iVar10;
            if ((uVar9 & 1) != 0) {
              bVar37 = (byte)uVar9 >> 3 & 1;
              if ((bVar37 != 0) ||
                 (((uVar9 & 6) != 0) != (hints->axis[1].major_dir == (int)pAVar18->dir))) {
                lVar26 = (long)pAVar18->fpos;
                lVar11 = ((AF_WidthRec *)&pAVar41->org)->org;
                lVar27 = lVar26 - lVar11;
                lVar28 = -lVar27;
                if (0 < lVar27) {
                  lVar28 = lVar27;
                }
                lVar28 = (int)lVar28 * lVar32;
                uVar29 = lVar28 + (lVar28 >> 0x3f) + 0x8000;
                iVar40 = (int)(uVar29 >> 0x10);
                iVar39 = iVar40;
                if (iVar10 < iVar40) {
                  iVar39 = iVar10;
                }
                if (iVar40 < iVar10) {
                  pAVar13 = pAVar41;
                  bVar7 = bVar37;
                }
                if ((((bVar37 == 0) && (((uVar9 & 6) != 0) == lVar11 <= lVar26)) &&
                    ((pAVar18->flags & 1) != 0)) && ((uVar29 & 0xffffffff0000) != 0)) {
                  lVar26 = lVar26 - pAVar41[1].org;
                  lVar11 = -lVar26;
                  if (0 < lVar26) {
                    lVar11 = lVar26;
                  }
                  lVar11 = (int)lVar11 * lVar32;
                  iVar10 = (int)((ulong)(lVar11 + (lVar11 >> 0x3f) + 0x8000) >> 0x10);
                  if (iVar10 < iVar39) {
                    pAVar13 = pAVar41 + 1;
                    bVar7 = 0;
                    iVar39 = iVar10;
                  }
                }
              }
            }
            pAVar41 = pAVar41 + 3;
            iVar10 = iVar39;
          }
          if ((pAVar13 != (AF_Width)0x0) && (pAVar18->blue_edge = pAVar13, bVar7 != 0)) {
            pAVar18->flags = pAVar18->flags | 8;
          }
        }
      }
    }
    for (lVar32 = 0; lVar32 != 2; lVar32 = lVar32 + 1) {
      if (lVar32 == 0) {
        uVar9 = hints->scaler_flags & 1;
      }
      else {
        uVar9 = hints->scaler_flags & 2;
      }
      if (uVar9 == 0) {
        pAVar1 = hints->axis + lVar32;
        pAVar18 = hints->axis[lVar32].edges;
        if (pAVar18 == (AF_Edge_conflict)0x0) {
          pAVar38 = (AF_Edge_conflict)0x0;
        }
        else {
          pAVar38 = pAVar18 + pAVar1->num_edges;
        }
        if (lVar32 == 1) {
          FVar2 = af_script_classes[hints->metrics->style_class->script]->top_to_bottom_hinting;
          pAVar14 = (AF_Edge_conflict)0x0;
          for (pAVar24 = pAVar18; pAVar24 < pAVar38; pAVar24 = pAVar24 + 1) {
            bVar7 = pAVar24->flags;
            if ((bVar7 & 4) == 0) {
              pAVar13 = pAVar24->blue_edge;
              pAVar25 = pAVar24->link;
              pAVar15 = pAVar24;
              if (pAVar25 == (AF_Edge_conflict)0x0 || pAVar13 == (AF_Width)0x0) {
LAB_00227319:
                if (pAVar13 == (AF_Width)0x0 && pAVar25 != (AF_Edge_conflict)0x0) {
                  pAVar13 = pAVar25->blue_edge;
                  pAVar15 = pAVar25;
                  pAVar25 = pAVar24;
                }
                if (pAVar13 == (AF_Width)0x0) goto LAB_00227383;
              }
              else if (pAVar25->blue_edge != (AF_Width)0x0) {
                if ((pAVar25->flags & 8) == 0) {
                  if ((bVar7 & 8) == 0) goto LAB_00227340;
                  pAVar24->blue_edge = (AF_Width)0x0;
                  pAVar24->flags = bVar7 & 0xf3;
                  pAVar13 = (AF_Width)0x0;
                }
                else {
                  pAVar25->blue_edge = (AF_Width)0x0;
                  pAVar25->flags = pAVar25->flags & 0xf7;
                  pAVar13 = pAVar24->blue_edge;
                }
                goto LAB_00227319;
              }
LAB_00227340:
              pAVar15->pos = pAVar13->fit;
              pAVar15->flags = pAVar15->flags | 4;
              if ((pAVar25 != (AF_Edge_conflict)0x0) && (pAVar25->blue_edge == (AF_Width)0x0)) {
                af_latin_align_linked_edge(hints,AF_DIMENSION_VERT,pAVar15,pAVar25);
                pAVar25->flags = pAVar25->flags | 4;
              }
              if (pAVar14 == (AF_Edge_conflict)0x0) {
                pAVar14 = pAVar24;
              }
            }
LAB_00227383:
          }
          bVar42 = FVar2 == '\0';
        }
        else {
          bVar42 = true;
          pAVar14 = (AF_Edge_conflict)0x0;
        }
        local_54 = 0;
        for (pAVar24 = pAVar18; dim = (AF_Dimension)lVar32, pAVar24 < pAVar38; pAVar24 = pAVar24 + 1
            ) {
          bVar7 = pAVar24->flags;
          if ((bVar7 & 4) == 0) {
            pAVar25 = pAVar24->link;
            if (pAVar25 == (AF_Edge_conflict)0x0) {
              local_54 = local_54 + 1;
            }
            else if (pAVar25->blue_edge == (AF_Width)0x0) {
              lVar11 = pAVar24->opos;
              if (pAVar14 == (AF_Edge_conflict)0x0) {
                lVar28 = pAVar25->opos - lVar11;
                FVar19 = af_latin_compute_stem_width
                                   (hints,dim,lVar28,0,(uint)bVar7,(uint)pAVar25->flags);
                if (FVar19 < 0x60) {
                  lVar28 = lVar28 >> 1;
                  lVar26 = lVar28 + lVar11;
                  uVar30 = lVar28 + lVar11 + 0x20U & 0xffffffffffffffc0;
                  uVar29 = uVar30 - 0x26;
                  uVar12 = 0x1a;
                  if (FVar19 < 0x41) {
                    uVar29 = uVar30 - 0x20;
                    uVar12 = 0x20;
                  }
                  uVar33 = lVar26 - uVar29;
                  uVar31 = -uVar33;
                  if (0 < (long)uVar33) {
                    uVar31 = uVar33;
                  }
                  uVar36 = lVar26 - (uVar12 | uVar30);
                  uVar33 = -uVar36;
                  if (0 < (long)uVar36) {
                    uVar33 = uVar36;
                  }
                  uVar12 = uVar12 | uVar30;
                  if (uVar31 < uVar33) {
                    uVar12 = uVar29;
                  }
                  lVar11 = FVar19 / -2 + uVar12;
                  pAVar24->pos = lVar11;
                  uVar12 = lVar11 + FVar19;
                  pAVar14 = pAVar25;
                }
                else {
                  uVar12 = lVar11 + 0x20U & 0xffffffffffffffc0;
                  pAVar14 = pAVar24;
                }
                pAVar14->pos = uVar12;
                pAVar24->flags = bVar7 | 4;
                af_latin_align_linked_edge(hints,dim,pAVar24,pAVar25);
                pAVar14 = pAVar24;
              }
              else {
                lVar28 = (lVar11 - pAVar14->opos) + pAVar14->pos;
                lVar11 = pAVar25->opos - lVar11;
                bVar37 = pAVar25->flags;
                uVar12 = af_latin_compute_stem_width(hints,dim,lVar11,0,(uint)bVar7,(uint)bVar37);
                if ((bVar37 & 4) == 0) {
                  lVar26 = (lVar11 >> 1) + lVar28;
                  if ((long)uVar12 < 0x60) {
                    uVar30 = lVar26 + 0x20U & 0xffffffffffffffc0;
                    uVar31 = uVar30 - 0x26;
                    uVar29 = 0x1a;
                    if ((long)uVar12 < 0x41) {
                      uVar31 = uVar30 - 0x20;
                      uVar29 = 0x20;
                    }
                    uVar36 = lVar26 - uVar31;
                    uVar33 = -uVar36;
                    if (0 < (long)uVar36) {
                      uVar33 = uVar36;
                    }
                    uVar21 = lVar26 - (uVar29 | uVar30);
                    uVar36 = -uVar21;
                    if (0 < (long)uVar21) {
                      uVar36 = uVar21;
                    }
                    uVar30 = uVar29 | uVar30;
                    if (uVar33 < uVar36) {
                      uVar30 = uVar31;
                    }
                    uVar12 = (long)uVar12 / 2;
                    pAVar24->pos = uVar30 - uVar12;
                  }
                  else {
                    uVar31 = lVar28 + 0x20U & 0xffffffffffffffc0;
                    uVar30 = (uVar31 + (uVar12 >> 1)) - lVar26;
                    uVar29 = -uVar30;
                    if (0 < (long)uVar30) {
                      uVar29 = uVar30;
                    }
                    uVar30 = (lVar28 + lVar11 + 0x20U & 0xffffffffffffffc0) - uVar12;
                    uVar36 = ((uVar12 >> 1) - lVar26) + uVar30;
                    uVar33 = -uVar36;
                    if (0 < (long)uVar36) {
                      uVar33 = uVar36;
                    }
                    if (uVar29 < uVar33) {
                      uVar30 = uVar31;
                    }
                    pAVar24->pos = uVar30;
                  }
                  FVar19 = uVar30 + uVar12;
                  pAVar15 = pAVar25;
                }
                else {
                  FVar19 = pAVar25->pos - uVar12;
                  pAVar15 = pAVar24;
                }
                pAVar15->pos = FVar19;
                pAVar24->flags = bVar7 | 4;
                pAVar25->flags = pAVar25->flags | 4;
                if (pAVar18 < pAVar24) {
                  lVar11 = pAVar24[-1].pos;
                  if (bVar42) {
                    if (pAVar24->pos < lVar11) {
LAB_0022768b:
                      uVar29 = pAVar25->pos - lVar11;
                      uVar12 = -uVar29;
                      if (0 < (long)uVar29) {
                        uVar12 = uVar29;
                      }
                      if (0x10 < uVar12) {
                        pAVar24->pos = lVar11;
                      }
                    }
                  }
                  else if (lVar11 < pAVar24->pos) goto LAB_0022768b;
                }
              }
            }
            else {
              af_latin_align_linked_edge(hints,dim,pAVar25,pAVar24);
              pAVar24->flags = pAVar24->flags | 4;
            }
          }
        }
        if (lVar32 == 0) {
          lVar11 = (long)pAVar38 - (long)pAVar18;
          if (lVar11 == 0x420) {
            pAVar24 = pAVar18 + 1;
            lVar28 = 0x318;
            lVar26 = 0x1b8;
          }
          else {
            if (lVar11 != 0x210) goto LAB_002276b9;
            lVar28 = 0x160;
            lVar26 = 0xb0;
            pAVar24 = pAVar18;
          }
          uVar29 = *(long *)((long)&pAVar18->opos + lVar26) * 2 -
                   (pAVar24->opos + *(long *)((long)&pAVar18->opos + lVar28));
          uVar12 = -uVar29;
          if (0 < (long)uVar29) {
            uVar12 = uVar29;
          }
          if (uVar12 < 8) {
            lVar35 = *(long *)((long)&pAVar18->pos + lVar26) * 2 - pAVar24->pos;
            lVar26 = *(long *)((long)&pAVar18->link + lVar28);
            lVar27 = *(long *)((long)&pAVar18->pos + lVar28) - lVar35;
            *(long *)((long)&pAVar18->pos + lVar28) = lVar35;
            if (lVar26 != 0) {
              *(long *)(lVar26 + 0x10) = *(long *)(lVar26 + 0x10) - lVar27;
            }
            if (lVar11 == 0x420) {
              pAVar18[8].pos = pAVar18[8].pos - lVar27;
              pAVar18[0xb].pos = pAVar18[0xb].pos - lVar27;
            }
            (&pAVar18->flags)[lVar28] = (&pAVar18->flags)[lVar28] | 4;
            if (lVar26 != 0) {
              *(byte *)(lVar26 + 0x18) = *(byte *)(lVar26 + 0x18) | 4;
            }
          }
        }
LAB_002276b9:
        if ((local_54 != 0) || (pAVar14 == (AF_Edge_conflict)0x0)) {
          pAVar24 = pAVar18 + -1;
          pAVar25 = pAVar18;
          for (pAVar15 = pAVar18; pAVar25 = pAVar25 + 1, pAVar15 < pAVar38; pAVar15 = pAVar15 + 1) {
            bVar7 = pAVar15->flags;
            if ((bVar7 & 4) == 0) {
              pAVar3 = pAVar15->serif;
              if (pAVar3 == (AF_Edge)0x0) {
LAB_00227737:
                pAVar23 = pAVar24;
                if (pAVar14 != (AF_Edge_conflict)0x0) {
                  do {
                    pAVar22 = pAVar23;
                    pAVar6 = pAVar25;
                    if (pAVar22 < pAVar18) break;
                    pAVar23 = pAVar22 + -1;
                  } while ((pAVar22->flags & 4) == 0);
                  do {
                    pAVar23 = pAVar6;
                    if (pAVar38 <= pAVar23) break;
                    pAVar6 = pAVar23 + 1;
                  } while ((pAVar23->flags & 4) == 0);
                  if ((((pAVar23 < pAVar38) && (pAVar18 <= pAVar22)) && (pAVar22 < pAVar15)) &&
                     (pAVar15 < pAVar23)) {
                    uVar12 = pAVar22->pos;
                    lVar11 = pAVar23->opos - pAVar22->opos;
                    if (lVar11 != 0) {
                      FVar16 = FT_MulDiv(pAVar15->opos - pAVar22->opos,pAVar23->pos - uVar12,lVar11)
                      ;
                      uVar12 = uVar12 + FVar16;
                      pAVar15->pos = uVar12;
                      bVar7 = pAVar15->flags;
                      goto LAB_002277fe;
                    }
                  }
                  else {
                    uVar12 = ((pAVar15->opos - pAVar14->opos) + 0x10U & 0xffffffffffffffe0) +
                             pAVar14->pos;
                  }
                  goto LAB_002277f9;
                }
                uVar12 = pAVar15->opos + 0x20U & 0xffffffffffffffc0;
                pAVar15->pos = uVar12;
                pAVar14 = pAVar15;
              }
              else {
                uVar29 = pAVar3->opos - pAVar15->opos;
                uVar12 = -uVar29;
                if (0 < (long)uVar29) {
                  uVar12 = uVar29;
                }
                if (0x4f < uVar12) goto LAB_00227737;
                uVar12 = (pAVar15->opos - pAVar3->opos) + pAVar3->pos;
LAB_002277f9:
                pAVar15->pos = uVar12;
              }
LAB_002277fe:
              pAVar15->flags = bVar7 | 4;
              if (pAVar18 < pAVar15) {
                uVar29 = pAVar15[-1].pos;
                if (bVar42) {
                  if ((long)uVar12 < (long)uVar29) {
LAB_00227822:
                    if (pAVar15->link != (AF_Edge)0x0) {
                      uVar31 = pAVar15->link->pos - uVar29;
                      uVar30 = -uVar31;
                      if (0 < (long)uVar31) {
                        uVar30 = uVar31;
                      }
                      if (0x10 < uVar30) {
                        pAVar15->pos = uVar29;
                        uVar12 = uVar29;
                      }
                    }
                  }
                }
                else if ((long)uVar29 < (long)uVar12) goto LAB_00227822;
              }
              if ((pAVar15 + 1 < pAVar38) && ((pAVar15[1].flags & 4) != 0)) {
                lVar11 = pAVar15[1].pos;
                if (bVar42) {
                  if (lVar11 < (long)uVar12) {
LAB_00227886:
                    if (pAVar15->link != (AF_Edge)0x0) {
                      uVar29 = pAVar15->link->pos - pAVar15[-1].pos;
                      uVar12 = -uVar29;
                      if (0 < (long)uVar29) {
                        uVar12 = uVar29;
                      }
                      if (0x10 < uVar12) {
                        pAVar15->pos = lVar11;
                      }
                    }
                  }
                }
                else if ((long)uVar12 < lVar11) goto LAB_00227886;
              }
            }
            pAVar24 = pAVar24 + 1;
          }
        }
        pAVar17 = pAVar1->segments;
        if (pAVar17 == (AF_Segment_conflict)0x0) {
          pAVar20 = (AF_Segment_conflict)0x0;
        }
        else {
          pAVar20 = pAVar17 + pAVar1->num_segments;
        }
        if (lVar32 == 0) {
          for (; pAVar17 < pAVar20; pAVar17 = pAVar17 + 1) {
            if (pAVar17->edge != (AF_Edge_conflict)0x0) {
              pAVar4 = (AF_Segment_conflict)pAVar17->last;
              pAVar5 = (AF_Segment)pAVar17->edge->pos;
              pAVar34 = pAVar17;
              do {
                pAVar34 = (AF_Segment_conflict)pAVar34->first;
                pAVar34->link = pAVar5;
                pAVar34->flags = (byte)*(FT_UShort *)&pAVar34->flags | 4;
              } while (pAVar34 != pAVar4);
            }
          }
        }
        else {
          for (; pAVar17 < pAVar20; pAVar17 = pAVar17 + 1) {
            if (pAVar17->edge != (AF_Edge_conflict)0x0) {
              pAVar4 = (AF_Segment_conflict)pAVar17->last;
              pAVar5 = (AF_Segment)pAVar17->edge->pos;
              pAVar34 = pAVar17;
              do {
                pAVar34 = (AF_Segment_conflict)pAVar34->first;
                pAVar34->serif = pAVar5;
                pAVar34->flags = (byte)*(FT_UShort *)&pAVar34->flags | 8;
              } while (pAVar34 != pAVar4);
            }
          }
        }
        af_glyph_hints_align_strong_points(hints,dim);
        af_glyph_hints_align_weak_points(hints,dim);
      }
    }
    af_glyph_hints_save(hints,outline);
    FVar8 = 0;
  }
  return FVar8;
}

Assistant:

static FT_Error
  af_latin_hints_apply( FT_UInt          glyph_index,
                        AF_GlyphHints    hints,
                        FT_Outline*      outline,
                        AF_LatinMetrics  metrics )
  {
    FT_Error  error;
    int       dim;

    AF_LatinAxis  axis;


    error = af_glyph_hints_reload( hints, outline );
    if ( error )
      goto Exit;

    /* analyze glyph outline */
    if ( AF_HINTS_DO_HORIZONTAL( hints ) )
    {
      axis  = &metrics->axis[AF_DIMENSION_HORZ];
      error = af_latin_hints_detect_features( hints,
                                              axis->width_count,
                                              axis->widths,
                                              AF_DIMENSION_HORZ );
      if ( error )
        goto Exit;
    }

    if ( AF_HINTS_DO_VERTICAL( hints ) )
    {
      axis  = &metrics->axis[AF_DIMENSION_VERT];
      error = af_latin_hints_detect_features( hints,
                                              axis->width_count,
                                              axis->widths,
                                              AF_DIMENSION_VERT );
      if ( error )
        goto Exit;

      /* apply blue zones to base characters only */
      if ( !( metrics->root.globals->glyph_styles[glyph_index] & AF_NONBASE ) )
        af_latin_hints_compute_blue_edges( hints, metrics );
    }

    /* grid-fit the outline */
    for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
    {
      if ( ( dim == AF_DIMENSION_HORZ && AF_HINTS_DO_HORIZONTAL( hints ) ) ||
           ( dim == AF_DIMENSION_VERT && AF_HINTS_DO_VERTICAL( hints ) )   )
      {
        af_latin_hint_edges( hints, (AF_Dimension)dim );
        af_glyph_hints_align_edge_points( hints, (AF_Dimension)dim );
        af_glyph_hints_align_strong_points( hints, (AF_Dimension)dim );
        af_glyph_hints_align_weak_points( hints, (AF_Dimension)dim );
      }
    }

    af_glyph_hints_save( hints, outline );

  Exit:
    return error;
  }